

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O1

size_type ot::commissioner::EndsWithAtPos(string *testString,string *subString)

{
  ulong uVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  bool bVar5;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  uVar1 = testString->_M_string_length;
  sVar2 = subString->_M_string_length;
  sVar4 = 0xffffffffffffffff;
  if (subString->_M_string_length <= uVar1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)testString);
    bVar5 = true;
    if (local_38 == subString->_M_string_length) {
      if (local_38 == 0) {
        bVar5 = false;
      }
      else {
        iVar3 = bcmp(local_40,(subString->_M_dataplus)._M_p,local_38);
        bVar5 = iVar3 != 0;
      }
    }
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    sVar4 = uVar1 - sVar2;
    if (bVar5) {
      sVar4 = 0xffffffffffffffff;
    }
  }
  return sVar4;
}

Assistant:

static std::string::size_type EndsWithAtPos(const std::string &testString, const std::string &subString)
{
    auto result = std::string::npos;
    ;

    if (testString.length() >= subString.length())
    {
        result = testString.length() - subString.length();
        if (testString.substr(result) != subString)
        {
            result = std::string::npos;
        }
    }
    return result;
}